

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O1

void __thiscall RtApiAlsa::probeDevices(RtApiAlsa *this)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *__args;
  size_t __n;
  pointer pcVar1;
  void *pvVar2;
  pointer ppVar3;
  long lVar4;
  pointer __pos;
  undefined8 *puVar5;
  undefined1 *puVar6;
  _Alloc_hider _Var7;
  undefined1 auVar8 [8];
  uint uVar9;
  vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
  *this_00;
  int iVar10;
  int iVar11;
  long lVar12;
  size_t sVar13;
  string *this_01;
  undefined8 uVar14;
  undefined8 uVar15;
  ostream *poVar16;
  char *pcVar17;
  iterator __position;
  iterator __position_00;
  ulong uVar18;
  pointer ppVar19;
  undefined8 *puVar20;
  long *plVar21;
  char *__s;
  pointer ppVar22;
  void *__s_00;
  bool bVar23;
  bool bVar24;
  undefined8 uStack_200;
  char local_1f8 [8];
  char name [128];
  string local_170;
  undefined1 local_150 [8];
  string prettyName;
  string defaultDeviceName;
  string id;
  undefined1 local_e8 [8];
  DeviceInfo info;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  deviceID_prettyName;
  long local_50;
  snd_ctl_t *handle;
  ostream *poStack_40;
  int device;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *__range2;
  int card;
  
  local_50 = 0;
  uStack_200 = 0x18ba75;
  lVar12 = snd_ctl_card_info_sizeof();
  lVar12 = -(lVar12 + 0xfU & 0xfffffffffffffff0);
  __s = local_1f8 + lVar12;
  *(undefined8 *)((long)&uStack_200 + lVar12) = 0x18ba8b;
  sVar13 = snd_ctl_card_info_sizeof();
  *(undefined8 *)((long)&uStack_200 + lVar12) = 0x18ba98;
  memset(__s,0,sVar13);
  *(undefined8 *)((long)&uStack_200 + lVar12) = 0x18ba9d;
  lVar12 = snd_pcm_info_sizeof();
  __s_00 = __s + -(lVar12 + 0xfU & 0xfffffffffffffff0);
  *(undefined8 *)((long)__s_00 + -8) = 0x18bab3;
  sVar13 = snd_pcm_info_sizeof();
  *(undefined8 *)((long)__s_00 + -8) = 0x18bac0;
  memset(__s_00,0,sVar13);
  info.nativeFormats = 0;
  prettyName.field_2._8_8_ = &defaultDeviceName._M_string_length;
  defaultDeviceName._M_dataplus._M_p = (pointer)0x0;
  defaultDeviceName._M_string_length._0_1_ = 0;
  *(undefined8 *)((long)__s_00 + -8) = 0x18baee;
  iVar11 = snd_ctl_open(&local_50,"default",0);
  if (iVar11 == 0) {
    *(undefined8 *)((long)__s_00 + -8) = 0x18bb0c;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[8],_const_char_(&)[20],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e8,(char (*) [8])"default",(char (*) [20])"Default ALSA Device");
    *(undefined8 *)((long)__s_00 + -8) = 0x18bb1c;
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&info.nativeFormats,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e8);
    uVar14 = info.name.field_2._M_allocated_capacity;
    if ((uint *)info.name.field_2._M_allocated_capacity != &info.outputChannels) {
      *(undefined8 *)((long)__s_00 + -8) = 0x18bb31;
      operator_delete((void *)uVar14);
    }
    puVar6 = (undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
    if ((string *)puVar6 != &info.name) {
      *(undefined8 *)((long)__s_00 + -8) = 0x18bb46;
      operator_delete(puVar6);
    }
    *(undefined8 *)((long)__s_00 + -8) = 0x18bb5a;
    std::__cxx11::string::_M_assign((string *)(prettyName.field_2._M_local_buf + 8));
    lVar12 = local_50;
    *(undefined8 *)((long)__s_00 + -8) = 0x18bb63;
    snd_ctl_close(lVar12);
  }
  *(undefined8 *)((long)__s_00 + -8) = 0x18bb75;
  iVar11 = snd_ctl_open(&local_50,"pulse",0);
  if (iVar11 == 0) {
    *(undefined8 *)((long)__s_00 + -8) = 0x18bb93;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[6],_const_char_(&)[24],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e8,(char (*) [6])"pulse",(char (*) [24])"PulseAudio Sound Server");
    *(undefined8 *)((long)__s_00 + -8) = 0x18bba3;
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&info.nativeFormats,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e8);
    uVar14 = info.name.field_2._M_allocated_capacity;
    if ((uint *)info.name.field_2._M_allocated_capacity != &info.outputChannels) {
      *(undefined8 *)((long)__s_00 + -8) = 0x18bbb8;
      operator_delete((void *)uVar14);
    }
    puVar6 = (undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
    if ((string *)puVar6 != &info.name) {
      *(undefined8 *)((long)__s_00 + -8) = 0x18bbcd;
      operator_delete(puVar6);
    }
    lVar12 = local_50;
    *(undefined8 *)((long)__s_00 + -8) = 0x18bbd6;
    snd_ctl_close(lVar12);
  }
  __range2._4_4_ = -1;
  *(undefined8 *)((long)__s_00 + -8) = 0x18bbe5;
  snd_card_next();
  poStack_40 = (ostream *)&(this->super_RtApi).errorStream_;
  this_01 = &(this->super_RtApi).errorText_;
  while (-1 < __range2._4_4_) {
    *(undefined8 *)((long)__s_00 + -8) = 0x18bc26;
    sprintf(local_1f8,"hw:%d");
    *(undefined8 *)((long)__s_00 + -8) = 0x18bc34;
    iVar11 = snd_ctl_open(&local_50,local_1f8,0);
    poVar16 = poStack_40;
    lVar12 = local_50;
    if (iVar11 < 0) {
      local_50 = 0;
      *(undefined8 *)((long)__s_00 + -8) = 0x18bf60;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDevices: control open, card = ",0x2e);
      iVar10 = __range2._4_4_;
      poVar16 = poStack_40;
      *(undefined8 *)((long)__s_00 + -8) = 0x18bf6c;
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar10);
      *(undefined8 *)((long)__s_00 + -8) = 0x18bf83;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
      *(undefined8 *)((long)__s_00 + -8) = 0x18bf8b;
      pcVar17 = (char *)snd_strerror(iVar11);
      if (pcVar17 == (char *)0x0) {
        uVar14 = *(undefined8 *)(*(long *)poVar16 + -0x18);
        *(undefined8 *)((long)__s_00 + -8) = 0x18c099;
        std::ios::clear((int)poVar16 + (int)uVar14);
      }
      else {
        *(undefined8 *)((long)__s_00 + -8) = 0x18bf9f;
        sVar13 = strlen(pcVar17);
        *(undefined8 *)((long)__s_00 + -8) = 0x18bfad;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar13);
      }
      *(undefined8 *)((long)__s_00 + -8) = 0x18c0ad;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      *(undefined8 *)((long)__s_00 + -8) = 0x18c0c0;
      std::__cxx11::stringbuf::str();
    }
    else {
      *(undefined8 *)((long)__s_00 + -8) = 0x18bc4b;
      iVar11 = snd_ctl_card_info(lVar12,__s);
      poVar16 = poStack_40;
      if (iVar11 < 0) {
        *(undefined8 *)((long)__s_00 + -8) = 0x18bfc7;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"RtApiAlsa::probeDevices: control info, card = ",0x2e);
        iVar10 = __range2._4_4_;
        poVar16 = poStack_40;
        *(undefined8 *)((long)__s_00 + -8) = 0x18bfd3;
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar10);
        *(undefined8 *)((long)__s_00 + -8) = 0x18bfea;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
        *(undefined8 *)((long)__s_00 + -8) = 0x18bff2;
        pcVar17 = (char *)snd_strerror(iVar11);
        if (pcVar17 == (char *)0x0) {
          uVar14 = *(undefined8 *)(*(long *)poVar16 + -0x18);
          *(undefined8 *)((long)__s_00 + -8) = 0x18c0de;
          std::ios::clear((int)poVar16 + (int)uVar14);
        }
        else {
          *(undefined8 *)((long)__s_00 + -8) = 0x18c006;
          sVar13 = strlen(pcVar17);
          *(undefined8 *)((long)__s_00 + -8) = 0x18c014;
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar13);
        }
        *(undefined8 *)((long)__s_00 + -8) = 0x18c0f2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
        *(undefined8 *)((long)__s_00 + -8) = 0x18c105;
        std::__cxx11::stringbuf::str();
      }
      else {
        handle._4_4_ = 0xffffffff;
LAB_0018bc5d:
        lVar12 = local_50;
        *(undefined8 *)((long)__s_00 + -8) = 0x18bc6a;
        iVar11 = snd_ctl_pcm_next_device(lVar12,(long)&handle + 4);
        poVar16 = poStack_40;
        if (-1 < iVar11) {
          if (-1 < (int)handle._4_4_) {
            *(undefined8 *)((long)__s_00 + -8) = 0x18bc88;
            snd_pcm_info_set_device(__s_00);
            *(undefined8 *)((long)__s_00 + -8) = 0x18bc92;
            snd_pcm_info_set_subdevice(__s_00,0);
            *(undefined8 *)((long)__s_00 + -8) = 0x18bc9c;
            snd_pcm_info_set_stream(__s_00,0);
            lVar12 = local_50;
            *(undefined8 *)((long)__s_00 + -8) = 0x18bca8;
            iVar11 = snd_ctl_pcm_info(lVar12,__s_00);
            if (iVar11 < 0) goto LAB_0018be1d;
            goto LAB_0018bcb0;
          }
          goto LAB_0018c179;
        }
        *(undefined8 *)((long)__s_00 + -8) = 0x18c02e;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"RtApiAlsa::probeDevices: control next device, card = ",0x35);
        iVar10 = __range2._4_4_;
        poVar16 = poStack_40;
        *(undefined8 *)((long)__s_00 + -8) = 0x18c03a;
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar10);
        *(undefined8 *)((long)__s_00 + -8) = 0x18c051;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
        *(undefined8 *)((long)__s_00 + -8) = 0x18c059;
        pcVar17 = (char *)snd_strerror(iVar11);
        if (pcVar17 == (char *)0x0) {
          uVar14 = *(undefined8 *)(*(long *)poVar16 + -0x18);
          *(undefined8 *)((long)__s_00 + -8) = 0x18c120;
          std::ios::clear((int)poVar16 + (int)uVar14);
        }
        else {
          *(undefined8 *)((long)__s_00 + -8) = 0x18c06d;
          sVar13 = strlen(pcVar17);
          *(undefined8 *)((long)__s_00 + -8) = 0x18c07b;
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar13);
        }
        *(undefined8 *)((long)__s_00 + -8) = 0x18c134;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
        *(undefined8 *)((long)__s_00 + -8) = 0x18c147;
        std::__cxx11::stringbuf::str();
      }
    }
    *(undefined8 *)((long)__s_00 + -8) = 0x18c153;
    std::__cxx11::string::operator=((string *)this_01,(string *)local_e8);
    puVar6 = (undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
    if ((string *)puVar6 != &info.name) {
      *(undefined8 *)((long)__s_00 + -8) = 0x18c16b;
      operator_delete(puVar6);
    }
    *(undefined8 *)((long)__s_00 + -8) = 0x18c179;
    RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
LAB_0018c179:
    if (local_50 != 0) {
      *(undefined8 *)((long)__s_00 + -8) = 0x18c187;
      snd_ctl_close();
    }
    *(undefined8 *)((long)__s_00 + -8) = 0x18c190;
    snd_card_next((long)&__range2 + 4);
  }
  if (info.nativeFormats != 0) {
    poStack_40 = (ostream *)&this->deviceIdPairs_;
    __position._M_current =
         (this->deviceIdPairs_).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
LAB_0018c1b9:
    do {
      if (__position._M_current ==
          (this->deviceIdPairs_).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0018c241;
      if (info.nativeFormats != 0) {
        sVar13 = ((__position._M_current)->first)._M_string_length;
        puVar5 = (undefined8 *)info.nativeFormats;
        do {
          puVar20 = puVar5 + 8;
          __n = puVar5[1];
          if (__n == sVar13) {
            if (__n == 0) {
              bVar23 = true;
            }
            else {
              pcVar1 = ((__position._M_current)->first)._M_dataplus._M_p;
              pvVar2 = (void *)*puVar5;
              *(undefined8 *)((long)__s_00 + -8) = 0x18c1f5;
              iVar11 = bcmp(pvVar2,pcVar1,__n);
              bVar23 = iVar11 == 0;
            }
          }
          else {
            bVar23 = false;
          }
          bVar24 = false;
          if (bVar23) {
            bVar24 = true;
            break;
          }
          puVar5 = puVar20;
        } while (puVar20 != (undefined8 *)0x0);
        if (bVar24) {
          __position._M_current = __position._M_current + 1;
          goto LAB_0018c1b9;
        }
      }
      poVar16 = poStack_40;
      *(undefined8 *)((long)__s_00 + -8) = 0x18c235;
      __position = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::_M_erase((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               *)poVar16,__position);
    } while( true );
  }
  __pos = (this->super_RtApi).deviceList_.
          super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
          super__Vector_impl_data._M_start;
  *(undefined8 *)((long)__s_00 + -8) = 0x18c4f8;
  std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::_M_erase_at_end
            (&(this->super_RtApi).deviceList_,__pos);
  *(undefined8 *)((long)__s_00 + -8) = 0x18c507;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::clear(&this->deviceIdPairs_);
  goto LAB_0018c507;
LAB_0018be1d:
  if (iVar11 == -2) {
    *(undefined8 *)((long)__s_00 + -8) = 0x18be33;
    snd_pcm_info_set_stream(__s_00,1);
    lVar12 = local_50;
    *(undefined8 *)((long)__s_00 + -8) = 0x18be3f;
    iVar11 = snd_ctl_pcm_info(lVar12,__s_00);
    poVar16 = poStack_40;
    if (iVar11 < 0) {
      *(undefined8 *)((long)__s_00 + -8) = 0x18be5e;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDevices: control pcm info, card = ",0x32);
      iVar10 = __range2._4_4_;
      poVar16 = poStack_40;
      *(undefined8 *)((long)__s_00 + -8) = 0x18be6a;
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar10);
      *(undefined8 *)((long)__s_00 + -8) = 0x18be81;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", device = ",0xb);
      uVar9 = handle._4_4_;
      *(undefined8 *)((long)__s_00 + -8) = 0x18be8c;
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar9);
      *(undefined8 *)((long)__s_00 + -8) = 0x18bea3;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
      *(undefined8 *)((long)__s_00 + -8) = 0x18beaa;
      pcVar17 = (char *)snd_strerror(iVar11);
      if (pcVar17 == (char *)0x0) {
        uVar14 = *(undefined8 *)(*(long *)poVar16 + -0x18);
        *(undefined8 *)((long)__s_00 + -8) = 0x18bee5;
        std::ios::clear((int)poVar16 + (int)uVar14);
      }
      else {
        *(undefined8 *)((long)__s_00 + -8) = 0x18beba;
        sVar13 = strlen(pcVar17);
        *(undefined8 *)((long)__s_00 + -8) = 0x18bec8;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar13);
      }
      *(undefined8 *)((long)__s_00 + -8) = 0x18bef9;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      *(undefined8 *)((long)__s_00 + -8) = 0x18bf0c;
      std::__cxx11::stringbuf::str();
      *(undefined8 *)((long)__s_00 + -8) = 0x18bf18;
      std::__cxx11::string::operator=((string *)this_01,(string *)local_e8);
      puVar6 = (undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
      if ((string *)puVar6 != &info.name) {
        *(undefined8 *)((long)__s_00 + -8) = 0x18bf30;
        operator_delete(puVar6);
      }
      *(undefined8 *)((long)__s_00 + -8) = 0x18bf3e;
      RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
    }
    else {
LAB_0018bcb0:
      *(undefined8 *)((long)__s_00 + -8) = 0x18bcb8;
      uVar14 = snd_ctl_card_info_get_id(__s);
      uVar18 = (ulong)handle._4_4_;
      *(undefined8 *)((long)__s_00 + -8) = 0x18bccf;
      sprintf(local_1f8,"hw:%s,%d",uVar14,uVar18);
      defaultDeviceName.field_2._8_8_ = &id._M_string_length;
      *(undefined8 *)((long)__s_00 + -8) = 0x18bce5;
      sVar13 = strlen(local_1f8);
      *(undefined8 *)((long)__s_00 + -8) = 0x18bcff;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&defaultDeviceName.field_2 + 8),local_1f8,local_1f8 + sVar13);
      *(undefined8 *)((long)__s_00 + -8) = 0x18bd07;
      uVar14 = snd_ctl_card_info_get_name(__s);
      *(undefined8 *)((long)__s_00 + -8) = 0x18bd12;
      uVar15 = snd_pcm_info_get_id(__s_00);
      *(undefined8 *)((long)__s_00 + -8) = 0x18bd29;
      sprintf(local_1f8,"%s (%s)",uVar14,uVar15);
      local_150 = (undefined1  [8])&prettyName._M_string_length;
      *(undefined8 *)((long)__s_00 + -8) = 0x18bd3f;
      sVar13 = strlen(local_1f8);
      *(undefined8 *)((long)__s_00 + -8) = 0x18bd5c;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_150,local_1f8,local_1f8 + sVar13);
      *(undefined8 *)((long)__s_00 + -8) = 0x18bd75;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&defaultDeviceName.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
      *(undefined8 *)((long)__s_00 + -8) = 0x18bd81;
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&info.nativeFormats,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_e8);
      uVar14 = info.name.field_2._M_allocated_capacity;
      if ((uint *)info.name.field_2._M_allocated_capacity != &info.outputChannels) {
        *(undefined8 *)((long)__s_00 + -8) = 0x18bd99;
        operator_delete((void *)uVar14);
      }
      puVar6 = (undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
      if ((string *)puVar6 != &info.name) {
        *(undefined8 *)((long)__s_00 + -8) = 0x18bdb1;
        operator_delete(puVar6);
      }
      if ((handle._4_4_ == 0 && __range2._4_4_ == 0) &&
         (defaultDeviceName._M_dataplus._M_p == (pointer)0x0)) {
        *(undefined8 *)((long)__s_00 + -8) = 0x18bdcd;
        strlen(local_1f8);
        *(undefined8 *)((long)__s_00 + -8) = 0x18bde4;
        std::__cxx11::string::_M_replace
                  ((ulong)((long)&prettyName.field_2 + 8),0,(char *)0x0,(ulong)local_1f8);
      }
      auVar8 = local_150;
      if (local_150 != (undefined1  [8])&prettyName._M_string_length) {
        *(undefined8 *)((long)__s_00 + -8) = 0x18bdfc;
        operator_delete((void *)auVar8);
      }
      uVar14 = defaultDeviceName.field_2._8_8_;
      if ((size_type *)defaultDeviceName.field_2._8_8_ != &id._M_string_length) {
        *(undefined8 *)((long)__s_00 + -8) = 0x18be18;
        operator_delete((void *)uVar14);
      }
    }
  }
  goto LAB_0018bc5d;
LAB_0018c241:
  if (info.nativeFormats != 0) {
    plVar21 = (long *)info.nativeFormats;
    do {
      ppVar19 = (this->deviceIdPairs_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = (this->deviceIdPairs_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar19 == ppVar3) {
LAB_0018c2e1:
        local_e8._0_4_ = 0;
        info._0_8_ = &info.name._M_string_length;
        info.name._M_dataplus._M_p = (pointer)0x0;
        info.name._M_string_length._0_1_ = 0;
        info.outputChannels = 0;
        info.inputChannels._0_1_ = 0;
        info.inputChannels._1_1_ = 0;
        info.name.field_2._8_4_ = 0;
        info.name.field_2._12_2_ = 0;
        info.name.field_2._14_2_ = 0;
        info.currentSampleRate = 0;
        info.preferredSampleRate = 0;
        info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        info.duplexChannels = 0;
        info.isDefaultOutput = false;
        info.isDefaultInput = false;
        info._54_2_ = 0;
        info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        *(undefined8 *)((long)__s_00 + -8) = 0x18c330;
        std::__cxx11::string::_M_assign((string *)&info);
        __args = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)((long)&defaultDeviceName.field_2 + 8);
        lVar12 = *plVar21;
        lVar4 = plVar21[1];
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        *(undefined8 *)((long)__s_00 + -8) = 0x18c358;
        std::__cxx11::string::_M_construct<char*>((string *)&local_170,lVar12,lVar4 + lVar12);
        *(undefined8 *)((long)__s_00 + -8) = 0x18c36a;
        bVar23 = probeDeviceInfo(this,(DeviceInfo *)local_e8,&local_170);
        _Var7._M_p = local_170._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          *(undefined8 *)((long)__s_00 + -8) = 0x18c37e;
          operator_delete(_Var7._M_p);
        }
        _Var7._M_p = info.name._M_dataplus._M_p;
        uVar15 = info._0_8_;
        uVar14 = prettyName.field_2._8_8_;
        if (bVar23) {
          local_e8._0_4_ = (this->super_RtApi).currentDeviceId_;
          (this->super_RtApi).currentDeviceId_ = local_e8._0_4_ + 1;
          if (info.name._M_dataplus._M_p == defaultDeviceName._M_dataplus._M_p) {
            if (info.name._M_dataplus._M_p != (pointer)0x0) {
              *(undefined8 *)((long)__s_00 + -8) = 0x18c3ca;
              iVar11 = bcmp((void *)uVar15,(void *)uVar14,(size_t)_Var7._M_p);
              if (iVar11 != 0) goto LAB_0018c3ee;
            }
            if (info.name.field_2._8_4_ != 0) {
              info.inputChannels._0_1_ = 1;
            }
            if (CONCAT22(info.name.field_2._14_2_,info.name.field_2._12_2_) != 0) {
              info.inputChannels._1_1_ = 1;
            }
          }
LAB_0018c3ee:
          *(undefined8 *)((long)__s_00 + -8) = 0x18c3fe;
          std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::push_back
                    (&(this->super_RtApi).deviceList_,(value_type *)local_e8);
          defaultDeviceName.field_2._8_8_ = &id._M_string_length;
          lVar12 = *plVar21;
          lVar4 = plVar21[1];
          *(undefined8 *)((long)__s_00 + -8) = 0x18c41f;
          std::__cxx11::string::_M_construct<char*>((string *)__args,lVar12,lVar4 + lVar12);
          this_00 = (vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                     *)poStack_40;
          id.field_2._8_4_ = local_e8._0_4_;
          *(undefined8 *)((long)__s_00 + -8) = 0x18c437;
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>>(this_00,__args);
          uVar14 = defaultDeviceName.field_2._8_8_;
          if ((size_type *)defaultDeviceName.field_2._8_8_ != &id._M_string_length) {
            *(undefined8 *)((long)__s_00 + -8) = 0x18c44f;
            operator_delete((void *)uVar14);
          }
        }
        uVar14 = info._48_8_;
        if (info._48_8_ != 0) {
          *(undefined8 *)((long)__s_00 + -8) = 0x18c460;
          operator_delete((void *)uVar14);
        }
        uVar14 = info._0_8_;
        if ((size_type *)info._0_8_ != &info.name._M_string_length) {
          *(undefined8 *)((long)__s_00 + -8) = 0x18c478;
          operator_delete((void *)uVar14);
        }
      }
      else {
        sVar13 = plVar21[1];
        bVar23 = false;
        do {
          ppVar22 = ppVar19 + 1;
          bVar24 = sVar13 == (ppVar19->first)._M_string_length;
          if (bVar24 && sVar13 != 0) {
            pcVar1 = (ppVar19->first)._M_dataplus._M_p;
            pvVar2 = (void *)*plVar21;
            *(undefined8 *)((long)__s_00 + -8) = 0x18c2aa;
            iVar11 = bcmp(pvVar2,pcVar1,sVar13);
            bVar24 = iVar11 == 0;
          }
          if (bVar24) {
            bVar23 = true;
            break;
          }
          ppVar19 = ppVar22;
        } while (ppVar22 != ppVar3);
        if (!bVar23) goto LAB_0018c2e1;
      }
      plVar21 = plVar21 + 8;
    } while (plVar21 != (long *)0x0);
  }
  __position_00._M_current =
       (this->super_RtApi).deviceList_.
       super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (__position_00._M_current !=
      (this->super_RtApi).deviceList_.
      super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      ppVar19 = (this->deviceIdPairs_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = (this->deviceIdPairs_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar19 != ppVar3) {
        do {
          if ((__position_00._M_current)->ID == ppVar19->second) break;
          ppVar19 = ppVar19 + 1;
        } while (ppVar19 != ppVar3);
      }
      if (ppVar19 == ppVar3) {
        *(undefined8 *)((long)__s_00 + -8) = 0x18c4d6;
        __position_00 =
             std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::_M_erase
                       (&(this->super_RtApi).deviceList_,__position_00);
      }
      else {
        __position_00._M_current = __position_00._M_current + 1;
      }
    } while (__position_00._M_current !=
             (this->super_RtApi).deviceList_.
             super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
LAB_0018c507:
  uVar14 = prettyName.field_2._8_8_;
  if ((size_type *)prettyName.field_2._8_8_ != &defaultDeviceName._M_string_length) {
    *(undefined8 *)((long)__s_00 + -8) = 0x18c51f;
    operator_delete((void *)uVar14);
  }
  *(undefined8 *)((long)__s_00 + -8) = 0x18c528;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&info.nativeFormats);
  return;
}

Assistant:

void RtApiAlsa :: probeDevices( void )
{
  // See list of required functionality in RtApi::probeDevices().
  
  int result, device, card;
  char name[128];
  snd_ctl_t *handle = 0;
  snd_ctl_card_info_t *ctlinfo;
  snd_pcm_info_t *pcminfo;
  snd_ctl_card_info_alloca(&ctlinfo);
  snd_pcm_info_alloca(&pcminfo);
  // First element isthe device hw ID, second is the device "pretty name"
  std::vector<std::pair<std::string, std::string>> deviceID_prettyName;
  snd_pcm_stream_t stream;
  std::string defaultDeviceName;

  // Add the default interface if available.
  result = snd_ctl_open( &handle, "default", 0 );
  if (result == 0) {
    deviceID_prettyName.push_back({"default", "Default ALSA Device"});
    defaultDeviceName = deviceID_prettyName[0].second;
    snd_ctl_close( handle );
  }

  // Add the Pulse interface if available.
  result = snd_ctl_open( &handle, "pulse", 0 );
  if (result == 0) {
    deviceID_prettyName.push_back({"pulse",  "PulseAudio Sound Server"});
    snd_ctl_close( handle );
  }
  
  // Count cards and devices and get ascii identifiers.
  card = -1;
  snd_card_next( &card );
  while ( card >= 0 ) {
    sprintf( name, "hw:%d", card );
    result = snd_ctl_open( &handle, name, 0 );
    if ( result < 0 ) {
      handle = 0;
      errorStream_ << "RtApiAlsa::probeDevices: control open, card = " << card << ", " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      error( RTAUDIO_WARNING );
      goto nextcard;
    }
    result = snd_ctl_card_info( handle, ctlinfo );
    if ( result < 0 ) {
      errorStream_ << "RtApiAlsa::probeDevices: control info, card = " << card << ", " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      error( RTAUDIO_WARNING );
      goto nextcard;
    }
    device = -1;
    while( 1 ) {
      result = snd_ctl_pcm_next_device( handle, &device );
      if ( result < 0 ) {
        errorStream_ << "RtApiAlsa::probeDevices: control next device, card = " << card << ", " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
        error( RTAUDIO_WARNING );
        break;
      }
      if ( device < 0 )
        break;

      snd_pcm_info_set_device( pcminfo, device );
      snd_pcm_info_set_subdevice( pcminfo, 0 );
      stream = SND_PCM_STREAM_PLAYBACK;
      snd_pcm_info_set_stream( pcminfo, stream );
      result = snd_ctl_pcm_info( handle, pcminfo );
      if ( result < 0 ) {
        if ( result == -ENOENT ) { // try as input stream
          stream = SND_PCM_STREAM_CAPTURE;
          snd_pcm_info_set_stream( pcminfo, stream );
          result = snd_ctl_pcm_info( handle, pcminfo );
          if ( result < 0 ) {
            errorStream_ << "RtApiAlsa::probeDevices: control pcm info, card = " << card << ", device = " << device << ", " << snd_strerror( result ) << ".";
            errorText_ = errorStream_.str();
            error( RTAUDIO_WARNING );
            continue;
          }
        }
        else continue;
      }
      sprintf( name, "hw:%s,%d", snd_ctl_card_info_get_id(ctlinfo), device );
      std::string id(name);
      sprintf( name, "%s (%s)", snd_ctl_card_info_get_name(ctlinfo), snd_pcm_info_get_id(pcminfo) );
      std::string prettyName(name);
      deviceID_prettyName.push_back( {id, prettyName} );
      if ( card == 0 && device == 0 && defaultDeviceName.empty() )
        defaultDeviceName = name;
    }
  nextcard:
    if ( handle )
      snd_ctl_close( handle );
    snd_card_next( &card );
  }

  if ( deviceID_prettyName.size() == 0 ) {
    deviceList_.clear();
    deviceIdPairs_.clear();
    return;
  }

  // Clean removed devices
  for ( auto it = deviceIdPairs_.begin(); it != deviceIdPairs_.end(); ) {
    bool found = false;
    for ( auto& d: deviceID_prettyName ) {
      if ( d.first == (*it).first ) {
        found = true;
        break;
      }
    }

    if ( found )
      ++it;
    else
      it = deviceIdPairs_.erase(it);
  }

  // Fill or update the deviceList_ and also save a corresponding list of Ids.
  for ( auto& d : deviceID_prettyName ) {
    bool found = false;
    for ( auto& dID : deviceIdPairs_ ) {
      if ( d.first == dID.first ) {
        found = true;
        break; // We already have this device.
      }
    }

    if ( found )
      continue;

    // new device
    RtAudio::DeviceInfo info;
    info.name = d.second;
    if ( probeDeviceInfo( info, d.first ) == false ) continue; // ignore if probe fails
    info.ID = currentDeviceId_++;  // arbitrary internal device ID
    if ( info.name == defaultDeviceName ) {
      if ( info.outputChannels > 0 ) info.isDefaultOutput = true;
      if ( info.inputChannels > 0 ) info.isDefaultInput = true;
    }
    deviceList_.push_back( info );
    deviceIdPairs_.push_back({d.first, info.ID});
    // I don't see that ALSA provides property listeners to know if
    // devices are removed or added.
  }

  // Remove any devices left in the list that are no longer available.
  for ( std::vector<RtAudio::DeviceInfo>::iterator it=deviceList_.begin(); it!=deviceList_.end(); )
  {
    auto itID = deviceIdPairs_.begin();
    while ( itID != deviceIdPairs_.end() ) {
      if ( (*it).ID == (*itID).second ) {
        break;
      }
      ++itID;
    }

    if ( itID == deviceIdPairs_.end() ) {
      // not found so remove it from our list
      it = deviceList_.erase( it );
    }
    else
      ++it;
  }
}